

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(cmGeneratorTarget *target)

{
  cmMakefile *this;
  bool bVar1;
  char *pcVar2;
  allocator local_79;
  string mocCppFile;
  string automocTargetName;
  string local_38;
  
  this = target->Target->Makefile;
  std::__cxx11::string::string((string *)&automocTargetName,"AUTOMOC",(allocator *)&mocCppFile);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&automocTargetName);
  std::__cxx11::string::~string((string *)&automocTargetName);
  if (bVar1) {
    GetAutogenTargetName_abi_cxx11_(&automocTargetName,target);
    pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this);
    std::__cxx11::string::string((string *)&mocCppFile,pcVar2,(allocator *)&local_38);
    std::__cxx11::string::append((char *)&mocCppFile);
    std::__cxx11::string::append((string *)&mocCppFile);
    std::__cxx11::string::append((char *)&mocCppFile);
    cmMakefile::GetOrCreateSource(this,&mocCppFile,true);
    std::__cxx11::string::string((string *)&local_38,"ADDITIONAL_MAKE_CLEAN_FILES",&local_79);
    cmMakefile::AppendProperty(this,&local_38,mocCppFile._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_38);
    cmGeneratorTarget::AddSource(target,&mocCppFile);
    std::__cxx11::string::~string((string *)&mocCppFile);
    std::__cxx11::string::~string((string *)&automocTargetName);
  }
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(
    cmGeneratorTarget* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = GetAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
}